

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

Value * __thiscall
Json::Path::resolve(Value *__return_storage_ptr__,Path *this,Value *root,Value *defaultValue)

{
  ArrayIndex index;
  ArrayIndex AVar1;
  PathArgument *arg;
  pointer pPVar2;
  Value *other;
  
  pPVar2 = (this->args_).super__Vector_base<Json::PathArgument,_std::allocator<Json::PathArgument>_>
           ._M_impl.super__Vector_impl_data._M_start;
  other = root;
  if (pPVar2 != (this->args_).
                super__Vector_base<Json::PathArgument,_std::allocator<Json::PathArgument>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    do {
      if (pPVar2->kind_ == kindKey) {
        other = defaultValue;
        if ((root->field_0x8 != '\a') ||
           (root = Value::operator[](root,(pPVar2->key_)._M_dataplus._M_p), other = defaultValue,
           root == (Value *)kNull)) break;
      }
      else if (pPVar2->kind_ == kindIndex) {
        other = defaultValue;
        if (root->field_0x8 != '\x06') break;
        index = pPVar2->index_;
        AVar1 = Value::size(root);
        other = defaultValue;
        if (AVar1 <= index) break;
        root = Value::operator[](root,index);
      }
      pPVar2 = pPVar2 + 1;
      other = root;
    } while (pPVar2 != (this->args_).
                       super__Vector_base<Json::PathArgument,_std::allocator<Json::PathArgument>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  Value::Value(__return_storage_ptr__,other);
  return __return_storage_ptr__;
}

Assistant:

Value Path::resolve(const Value& root, const Value& defaultValue) const {
  const Value* node = &root;
  for (Args::const_iterator it = args_.begin(); it != args_.end(); ++it) {
    const PathArgument& arg = *it;
    if (arg.kind_ == PathArgument::kindIndex) {
      if (!node->isArray() || !node->isValidIndex(arg.index_))
        return defaultValue;
      node = &((*node)[arg.index_]);
    } else if (arg.kind_ == PathArgument::kindKey) {
      if (!node->isObject())
        return defaultValue;
      node = &((*node)[arg.key_]);
      if (node == &Value::null)
        return defaultValue;
    }
  }
  return *node;
}